

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmcursor.cpp
# Opt level: O1

void __thiscall QEglFSKmsGbmCursor::updateMouseStatus(QEglFSKmsGbmCursor *this)

{
  CursorState CVar1;
  long lVar2;
  QEglFSKmsGbmScreen *pQVar3;
  DeviceType DVar4;
  int iVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CVar1 = this->m_state;
  DVar4 = QGuiApplicationPrivate::inputDeviceManager();
  iVar5 = QInputDeviceManager::deviceCount(DVar4);
  if ((CVar1 != CursorVisible) == 0 < iVar5) {
    this->m_state = (uint)(0 < iVar5) * 2 + CursorPendingHidden;
    pQVar3 = this->m_screen;
    (**(code **)(*(long *)this + 0x80))(this);
    uVar6 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3);
    (**(code **)(*(long *)this + 0x68))(this,0,uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsGbmCursor::updateMouseStatus()
{
    const bool wasVisible = m_state == CursorVisible;
    const bool visible = m_deviceListener->hasMouse();
    if (visible == wasVisible)
        return;

    m_state = visible ? CursorPendingVisible : CursorPendingHidden;

#ifndef QT_NO_CURSOR
    changeCursor(nullptr, m_screen->topLevelAt(pos()));
#endif
}